

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.cpp
# Opt level: O3

CharInfo MeCab::anon_unknown_3::encode
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *c,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                       *category)

{
  ostream *poVar1;
  iterator iVar2;
  ulong uVar3;
  CharInfo CVar4;
  key_type *__k;
  pointer pbVar5;
  long lVar6;
  die local_43;
  die local_42;
  die local_41;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
  *local_40;
  _Base_ptr local_38;
  
  __k = (c->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((c->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == __k) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x37);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"c.size()",8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"category size is empty",0x16);
    die::~die(&local_41);
    __k = (c->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  }
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
          ::find(&category->_M_t,__k);
  local_38 = &(category->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (iVar2._M_node == local_38) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x3a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"it != category->end()",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"category [",10);
    pbVar5 = (c->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] is undefined",0xe);
    die::~die(&local_42);
  }
  CVar4 = (CharInfo)iVar2._M_node[2]._M_color;
  pbVar5 = (c->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((c->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
    lVar6 = 0;
    uVar3 = 0;
    local_40 = &category->_M_t;
    do {
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
              ::find(local_40,(key_type *)((long)&(pbVar5->_M_dataplus)._M_p + lVar6));
      if (iVar2._M_node == local_38) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                   ,0x73);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x41);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"it != category->end()",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"category [",10);
        pbVar5 = (c->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar1,*(char **)((long)&(pbVar5->_M_dataplus)._M_p + lVar6),
                            *(long *)((long)&pbVar5->_M_string_length + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] is undefined",0xe);
        die::~die(&local_43);
      }
      CVar4 = (CharInfo)
              ((uint)CVar4 & 0xfffc0000 |
              (1 << ((byte)(iVar2._M_node[2]._M_color >> 0x12) & 0x1f)) + (int)CVar4 & 0x3ffffU);
      uVar3 = uVar3 + 1;
      pbVar5 = (c->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x20;
    } while (uVar3 < (ulong)((long)(c->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5))
    ;
  }
  return CVar4;
}

Assistant:

CharInfo encode(const std::vector<std::string> &c,
                std::map<std::string, CharInfo> *category) {
  CHECK_DIE(c.size()) << "category size is empty";

  std::map<std::string, CharInfo>::const_iterator it = category->find(c[0]);
  CHECK_DIE(it != category->end())
      << "category [" << c[0] << "] is undefined";

  CharInfo base = it->second;
  for (size_t i = 0; i < c.size(); ++i) {
    std::map<std::string, CharInfo>::const_iterator it =
        category->find(c[i]);
    CHECK_DIE(it != category->end())
        << "category [" << c[i] << "] is undefined";
    base.type += (1 << it->second.default_type);
  }

  return base;
}